

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnnbitfield * parsebitfield(rnndb *db,char *file,xmlNode *node)

{
  xmlAttr *attr;
  xmlChar *__s1;
  rnndb *db_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  rnnbitfield *prVar4;
  uint64_t uVar5;
  char *pcVar6;
  xmlNode *node_00;
  _xmlAttr **pp_Var7;
  _xmlNode **pp_Var8;
  
  prVar4 = (rnnbitfield *)calloc(0xe8,1);
  prVar4->file = file;
  pp_Var7 = &node->properties;
  bVar1 = false;
  bVar2 = false;
  do {
    attr = *pp_Var7;
    if (attr == (xmlAttr *)0x0) {
      pp_Var8 = &node->children;
      while (db_00 = (rnndb *)*pp_Var8, db_00 != (rnndb *)0x0) {
        if ((((*(int *)&(db_00->copyright).license == 1) &&
             (iVar3 = trytypetag(db,file,(xmlNode *)db_00,&prVar4->typeinfo), iVar3 == 0)) &&
            (pcVar6 = file, iVar3 = trytop(db,file,(xmlNode *)db_00), iVar3 == 0)) &&
           (iVar3 = trydoc(db_00,pcVar6,node_00), iVar3 == 0)) {
          fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)*(ushort *)&db_00->files,
                  node->name,(db_00->copyright).authors);
          db->estatus = 1;
        }
        pp_Var8 = (_xmlNode **)&db_00->bitsets;
      }
      if (prVar4->name == (char *)0x0) {
        pcVar6 = "%s:%d: nameless bitfield\n";
      }
      else {
        pcVar6 = "%s:%d: bitfield has wrong placement\n";
        if (((bVar1) && (bVar2)) && (prVar4->low <= prVar4->high)) {
          return prVar4;
        }
      }
      fprintf(_stderr,pcVar6,file,(ulong)node->line);
      db->estatus = 1;
      return (rnnbitfield *)0x0;
    }
    __s1 = attr->name;
    iVar3 = strcmp((char *)__s1,"name");
    if (iVar3 == 0) {
      pcVar6 = getattrib(db,file,(uint)node->line,attr);
      pcVar6 = strdup(pcVar6);
      prVar4->name = pcVar6;
    }
    else {
      iVar3 = strcmp((char *)__s1,"high");
      if (iVar3 == 0) {
        uVar5 = getnumattrib(db,file,(uint)node->line,attr);
        prVar4->high = (int)uVar5;
        bVar1 = true;
      }
      else {
        iVar3 = strcmp((char *)__s1,"low");
        if (iVar3 == 0) {
          uVar5 = getnumattrib(db,file,(uint)node->line,attr);
          prVar4->low = (int)uVar5;
        }
        else {
          iVar3 = strcmp((char *)__s1,"pos");
          if (iVar3 != 0) {
            iVar3 = strcmp((char *)__s1,"varset");
            if (iVar3 == 0) {
              pcVar6 = getattrib(db,file,(uint)node->line,attr);
              pcVar6 = strdup(pcVar6);
              (prVar4->varinfo).varsetstr = pcVar6;
            }
            else {
              iVar3 = strcmp((char *)__s1,"variants");
              if (iVar3 == 0) {
                pcVar6 = getattrib(db,file,(uint)node->line,attr);
                pcVar6 = strdup(pcVar6);
                (prVar4->varinfo).variantsstr = pcVar6;
              }
              else {
                iVar3 = trytypeattr(db,file,node,attr,&prVar4->typeinfo);
                if (iVar3 == 0) {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitfield\n",file,
                          (ulong)node->line,attr->name);
                  db->estatus = 1;
                }
              }
            }
            goto LAB_0024abcc;
          }
          uVar5 = getnumattrib(db,file,(uint)node->line,attr);
          prVar4->low = (int)uVar5;
          prVar4->high = (int)uVar5;
          bVar1 = true;
        }
        bVar2 = true;
      }
    }
LAB_0024abcc:
    pp_Var7 = &attr->next;
  } while( true );
}

Assistant:

static struct rnnbitfield *parsebitfield(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnbitfield *bf = calloc(sizeof *bf, 1);
	bf->file = file;
	xmlAttr *attr = node->properties;
	int highok = 0, lowok = 0;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			bf->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "high")) {
			bf->high = getnumattrib(db, file, node->line, attr);
			highok = 1;
		} else if (!strcmp(attr->name, "low")) {
			bf->low = getnumattrib(db, file, node->line, attr);
			lowok = 1;
		} else if (!strcmp(attr->name, "pos")) {
			bf->high = bf->low = getnumattrib(db, file, node->line, attr);
			lowok = highok = 1;
		} else if (!strcmp(attr->name, "varset")) {
			bf->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			bf->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!trytypeattr(db, file, node, attr, &bf->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for bitfield\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &bf->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!bf->name) {
		fprintf (stderr, "%s:%d: nameless bitfield\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else if (!highok || !lowok || bf->high < bf->low) {
		fprintf (stderr, "%s:%d: bitfield has wrong placement\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
		return bf;
	}
}